

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool __thiscall cfd::core::Script::IsP2shScript(Script *this)

{
  pointer pSVar1;
  size_t sVar2;
  bool bVar3;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  if ((((sVar2 == 0x17) &&
       (pSVar1 = (this->script_stack_).
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0x120)) &&
      ((pSVar1->op_code_).data_type_ == ScriptOperator::OP_HASH160._8_4_)) &&
     (pSVar1[1].type_ == kElementBinary)) {
    bVar3 = pSVar1[2].op_code_.data_type_ == ScriptOperator::OP_EQUAL._8_4_;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Script::IsP2shScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2shLength &&
      script_stack_.size() == 3 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_HASH160 &&
      script_stack_[1].IsBinary() &&
      script_stack_[2].GetOpCode() == ScriptOperator::OP_EQUAL);
}